

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O2

int crazyRead(void *context,char *buffer,int len)

{
  uint uVar1;
  char *pcVar2;
  clock_t cVar3;
  size_t sVar4;
  int iVar5;
  int iVar6;
  
  if (len < 0 || (buffer == (char *)0x0 || context == (void *)0x0)) {
    return -1;
  }
  cVar3 = clock();
  iVar6 = rlen;
  if ((cVar3 - t0 < 3000000) || (timeout = 1, instate != 1)) {
    if (instate == 0) {
      iVar5 = rlen - len;
      if (iVar5 == 0 || rlen < len) {
        sVar4 = (size_t)rlen;
        rlen = 0;
        memcpy(buffer,current,sVar4);
        curlen = 0;
        instate = 1;
        return iVar6;
      }
      goto LAB_00102f03;
    }
    if (instate == 1) {
      uVar1 = 0x1000;
      if ((uint)len < 0x1000) {
        uVar1 = len;
      }
      memcpy(buffer,filling,(ulong)uVar1);
      pcVar2 = crazy;
      curlen = curlen + uVar1;
      if (maxlen <= curlen) {
        sVar4 = strlen(crazy);
        rlen = (int)sVar4 - crazy_indx;
        current = pcVar2 + crazy_indx;
        instate = 2;
        return uVar1;
      }
      return uVar1;
    }
    if (instate != 2) {
      return 0;
    }
  }
  else {
    fprintf(_stderr,"\ntimeout in crazy(%d)\n",(ulong)crazy_indx);
    pcVar2 = crazy;
    sVar4 = strlen(crazy);
    current = pcVar2 + crazy_indx;
    instate = 2;
    iVar6 = (int)sVar4 - crazy_indx;
  }
  iVar5 = iVar6 - len;
  if (iVar5 == 0 || iVar6 < len) {
    rlen = 0;
    memcpy(buffer,current,(long)iVar6);
    instate = 3;
    curlen = 0;
    return iVar6;
  }
LAB_00102f03:
  pcVar2 = current;
  memcpy(buffer,current,(ulong)(uint)len);
  rlen = iVar5;
  current = pcVar2 + (uint)len;
  return len;
}

Assistant:

static int
crazyRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if ((check_time() <= 0) && (instate == 1)) {
        fprintf(stderr, "\ntimeout in crazy(%d)\n", crazy_indx);
        rlen = strlen(crazy) - crazy_indx;
        current = &crazy[crazy_indx];
        instate = 2;
    }
    if (instate == 0) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 1;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 2) {
        if (len >= rlen) {
            len = rlen;
            rlen = 0;
            memcpy(buffer, current, len);
            instate = 3;
            curlen = 0;
        } else {
            memcpy(buffer, current, len);
            rlen -= len;
            current += len;
        }
    } else if (instate == 1) {
        if (len > CHUNK) len = CHUNK;
        memcpy(buffer, &filling[0], len);
        curlen += len;
        if (curlen >= maxlen) {
            rlen = strlen(crazy) - crazy_indx;
            current = &crazy[crazy_indx];
            instate = 2;
        }
    } else
      len = 0;
    return (len);
}